

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

bool __thiscall
Assimp::OptimizeMeshesProcess::CanJoin
          (OptimizeMeshesProcess *this,uint a,uint b,uint verts,uint faces)

{
  uint uVar1;
  aiMesh *this_00;
  aiMesh *this_01;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  aiMesh *mb;
  aiMesh *ma;
  uint faces_local;
  uint verts_local;
  uint b_local;
  uint a_local;
  OptimizeMeshesProcess *this_local;
  
  pvVar4 = std::
           vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
           ::operator[](&this->meshes,(ulong)a);
  uVar1 = pvVar4->vertex_format;
  pvVar4 = std::
           vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
           ::operator[](&this->meshes,(ulong)b);
  if (uVar1 == pvVar4->vertex_format) {
    this_00 = this->mScene->mMeshes[a];
    this_01 = this->mScene->mMeshes[b];
    if ((((this->max_verts == 0xffffffff) || (verts + this_01->mNumVertices <= this->max_verts)) &&
        ((this->max_faces == 0xffffffff || (faces + this_01->mNumFaces <= this->max_faces)))) &&
       (this_00->mMaterialIndex == this_01->mMaterialIndex)) {
      bVar2 = aiMesh::HasBones(this_00);
      bVar3 = aiMesh::HasBones(this_01);
      if (bVar2 == bVar3) {
        if (((this->pts & 1U) != 0) && (this_00->mPrimitiveTypes != this_01->mPrimitiveTypes)) {
          return false;
        }
        bVar2 = aiMesh::HasBones(this_00);
        if (bVar2) {
          return false;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool OptimizeMeshesProcess::CanJoin ( unsigned int a, unsigned int b, unsigned int verts, unsigned int faces )
{
    if (meshes[a].vertex_format != meshes[b].vertex_format)
        return false;

    aiMesh* ma = mScene->mMeshes[a], *mb = mScene->mMeshes[b];

    if ((NotSet != max_verts && verts+mb->mNumVertices > max_verts) ||
        (NotSet != max_faces && faces+mb->mNumFaces    > max_faces)) {
        return false;
    }

    // Never merge unskinned meshes with skinned meshes
    if (ma->mMaterialIndex != mb->mMaterialIndex || ma->HasBones() != mb->HasBones())
        return false;

    // Never merge meshes with different kinds of primitives if SortByPType did already
    // do its work. We would destroy everything again ...
    if (pts && ma->mPrimitiveTypes != mb->mPrimitiveTypes)
        return false;

    // If both meshes are skinned, check whether we have many bones defined in both meshes.
    // If yes, we can join them.
    if (ma->HasBones()) {
        // TODO
        return false;
    }
    return true;
}